

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall kj::Promise<void>::fork(Promise<void> *this)

{
  PromiseArena *in_RAX;
  byte *pbVar1;
  PromiseNode *pPVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *in_RSI;
  PromiseArena *local_18;
  
  local_18 = in_RAX;
  kj::_::PromiseDisposer::
  alloc<kj::_::ForkHub<kj::_::Void>,kj::_::ForkHubBase,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_18,in_RSI,(SourceLocation *)&stack0x00000008);
  if (local_18 == (PromiseArena *)0x0) {
    pbVar1 = (byte *)0x0;
  }
  else {
    pbVar1 = local_18->bytes + *(long *)(*(long *)local_18->bytes + -0x10);
  }
  if ((PromiseArena *)pbVar1 == local_18) {
    pPVar2 = (PromiseNode *)
             &kj::_::StaticDisposerAdapter<kj::_::ForkHub<kj::_::Void>,kj::_::ForkHubBase>::instance
    ;
  }
  else {
    pPVar2 = (PromiseNode *)operator_new(0x10);
    (pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)&PTR___cxa_pure_virtual_006e1418;
    (pPVar2->super_PromiseArenaMember).arena = local_18;
    (pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)&PTR_disposeImpl_006e3768;
  }
  (this->super_PromiseBase).node.ptr = pPVar2;
  this[1].super_PromiseBase.node.ptr = (PromiseNode *)local_18;
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork(SourceLocation location) {
  return ForkedPromise<T>(false,
      _::PromiseDisposer::alloc<_::ForkHub<_::FixVoid<T>>, _::ForkHubBase>(kj::mv(node), location));
}